

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void __thiscall tcu::CommandLine::CommandLine(CommandLine *this,int argc,char **argv)

{
  bool bVar1;
  Exception *this_00;
  allocator<char> local_41;
  string local_40;
  
  this->_vptr_CommandLine = (_func_int **)&PTR_registerExtendedOptions_00a32740;
  de::cmdline::detail::CommandLine::CommandLine(&this->m_cmdLine);
  this->m_logFlags = 0;
  bVar1 = parse(this,argc,argv);
  if (bVar1) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Failed to parse command line",&local_41);
  Exception::Exception(this_00,&local_40);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

CommandLine::CommandLine (int argc, const char* const* argv)
	: m_logFlags	(0)
{
	if (!parse(argc, argv))
		throw Exception("Failed to parse command line");
}